

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DropTriggerPtr(Parse *pParse,Trigger *pTrigger)

{
  sqlite3 *db;
  char *zArg3;
  int iDb;
  int iVar1;
  Table *pTVar2;
  Vdbe *p;
  char *zArg1;
  
  db = pParse->db;
  iDb = sqlite3SchemaToIndex(db,pTrigger->pSchema);
  pTVar2 = tableOfTrigger(pTrigger);
  zArg3 = db->aDb[iDb].zDbSName;
  iVar1 = sqlite3AuthCheck(pParse,(uint)(iDb != 1) * 2 + 0xe,pTrigger->zName,pTVar2->zName,zArg3);
  if (iVar1 == 0) {
    zArg1 = "sqlite_master";
    if (iDb == 1) {
      zArg1 = "sqlite_temp_master";
    }
    iVar1 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,zArg3);
    if (iVar1 == 0) {
      p = sqlite3GetVdbe(pParse);
      if (p != (Vdbe *)0x0) {
        sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'trigger\'",
                           db->aDb[iDb].zDbSName);
        sqlite3ChangeCookie(pParse,iDb);
        sqlite3VdbeAddOp4(p,0x92,iDb,0,0,pTrigger->zName,0);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTriggerPtr(Parse *pParse, Trigger *pTrigger){
  Table   *pTable;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  iDb = sqlite3SchemaToIndex(pParse->db, pTrigger->pSchema);
  assert( iDb>=0 && iDb<db->nDb );
  pTable = tableOfTrigger(pTrigger);
  assert( pTable );
  assert( pTable->pSchema==pTrigger->pSchema || iDb==1 );
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_TRIGGER;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( iDb==1 ) code = SQLITE_DROP_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, pTrigger->zName, pTable->zName, zDb) ||
      sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      return;
    }
  }
#endif

  /* Generate code to destroy the database record of the trigger.
  */
  assert( pTable!=0 );
  if( (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='trigger'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pTrigger->zName
    );
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iDb, 0, 0, pTrigger->zName, 0);
  }
}